

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O3

uint8_t * __thiscall
Lodtalk::MethodAssembler::ConditionalJump::encode(ConditionalJump *this,uint8_t *buffer)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (this->destination->super_InstructionNode).position -
          ((this->super_InstructionNode).size + (this->super_InstructionNode).position);
  if (uVar2 != 0) {
    if (uVar2 < 9) {
      *buffer = (this->condition ^ 1U) * '\b' + (uint8_t)uVar2 + 0xb7;
      buffer = buffer + 1;
    }
    else {
      uVar1 = uVar2 + 0xff;
      if (-1 < (long)uVar2) {
        uVar1 = uVar2;
      }
      InstructionNode::encodeExtB(&this->super_InstructionNode,buffer,(long)uVar1 >> 8);
      *buffer = this->condition ^ 0xef;
      buffer[1] = (uint8_t)uVar2;
      buffer = buffer + 2;
    }
  }
  return buffer;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
	{
        auto delta = jumpDeltaValue();
        if(delta == 0)
            return buffer;

        if(1 <= delta && delta <= 8)
        {
            if(condition)
                *buffer++ = uint8_t(BytecodeSet::JumpOnTrueShortFirst + delta - 1);
            else
                *buffer++ = uint8_t(BytecodeSet::JumpOnFalseShortFirst + delta - 1);
            return buffer;
        }

        buffer = encodeExtB(buffer, delta / 256);
        *buffer++ = condition ? BytecodeSet::JumpOnTrue : BytecodeSet::JumpOnFalse;
        *buffer++ = delta % 256;
		return buffer;
	}